

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void qt_bitmapblit_quint16
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int x_1;
  ulong uVar5;
  int iVar6;
  quint32 *pqVar7;
  int iVar8;
  int iVar9;
  uchar uVar10;
  ushort local_70;
  uchar *local_68;
  
  uVar5 = color->rgba;
  local_70 = (ushort)(uint)(uVar5 >> 0x2b) & 0x1f |
             (ushort)(uVar5 >> 0x15) & 0x7e0 | (ushort)uVar5 & 0xf800;
  local_68 = rasterBuffer->m_buffer + (long)x * 2 + (long)y * rasterBuffer->bytes_per_line;
  iVar4 = (int)((ulong)rasterBuffer->bytes_per_line >> 1);
  if (mapWidth < 9) {
    if (0 < mapHeight) {
      do {
        uVar10 = *map;
        if (uVar10 != '\0') {
          iVar8 = 0;
          iVar6 = 0;
          do {
            if ((char)uVar10 < '\0') {
              iVar8 = iVar8 + 1;
            }
            else {
              if (iVar8 != 0) {
                pqVar7 = (quint32 *)(local_68 + (long)iVar6 * 2);
                uVar5 = (ulong)iVar8;
                if (((ulong)pqVar7 & 3) != 0) {
                  *(ushort *)pqVar7 = local_70;
                  pqVar7 = (quint32 *)((long)pqVar7 + 2);
                  uVar5 = uVar5 - 1;
                }
                if ((uVar5 & 1) != 0) {
                  *(ushort *)((long)pqVar7 + (uVar5 - 1) * 2) = local_70;
                }
                (*qt_memfill32)(pqVar7,CONCAT22(local_70,local_70),(long)uVar5 / 2);
                iVar6 = iVar6 + iVar8;
              }
              iVar6 = iVar6 + 1;
              iVar8 = 0;
            }
            uVar10 = uVar10 * '\x02';
          } while (uVar10 != '\0');
          if (iVar8 != 0) {
            pqVar7 = (quint32 *)(local_68 + (long)iVar6 * 2);
            uVar5 = (ulong)iVar8;
            if (((ulong)pqVar7 & 3) != 0) {
              *(ushort *)pqVar7 = local_70;
              pqVar7 = (quint32 *)((long)pqVar7 + 2);
              uVar5 = uVar5 - 1;
            }
            if ((uVar5 & 1) != 0) {
              *(ushort *)((long)pqVar7 + (uVar5 - 1) * 2) = local_70;
            }
            (*qt_memfill32)(pqVar7,CONCAT22(local_70,local_70),
                            (long)((int)(((uint)(uVar5 >> 0x1f) & 1) + (int)uVar5) >> 1));
          }
        }
        local_68 = local_68 + (long)iVar4 * 2;
        map = map + mapStride;
        bVar1 = 1 < mapHeight;
        mapHeight = mapHeight + -1;
      } while (bVar1);
    }
  }
  else if (0 < mapHeight) {
    do {
      uVar5 = 0;
      iVar6 = 0;
      iVar8 = 0;
LAB_00654c8a:
      do {
        uVar10 = map[uVar5 >> 3];
        iVar9 = -8;
        do {
          if ((char)uVar10 < '\0') {
            iVar6 = iVar6 + 1;
          }
          else {
            if (iVar6 == 0) {
              iVar2 = 1;
            }
            else {
              pqVar7 = (quint32 *)(local_68 + (long)iVar8 * 2);
              uVar3 = (ulong)iVar6;
              if (((ulong)pqVar7 & 3) != 0) {
                *(ushort *)pqVar7 = local_70;
                pqVar7 = (quint32 *)((long)pqVar7 + 2);
                uVar3 = uVar3 - 1;
              }
              if ((uVar3 & 1) != 0) {
                *(ushort *)((long)pqVar7 + (uVar3 - 1) * 2) = local_70;
              }
              (*qt_memfill32)(pqVar7,CONCAT22(local_70,local_70),(long)uVar3 / 2);
              iVar2 = iVar6 + 1;
            }
            if (uVar10 == '\0') {
              iVar8 = (iVar6 + iVar8) - iVar9;
              uVar5 = uVar5 + 8;
              iVar6 = 0;
              if (mapWidth <= (int)uVar5) goto LAB_00654d8d;
              goto LAB_00654c8a;
            }
            iVar8 = iVar8 + iVar2;
            iVar6 = 0;
          }
          uVar10 = uVar10 * '\x02';
          iVar9 = iVar9 + 1;
        } while (iVar9 != 0);
        uVar5 = uVar5 + 8;
      } while ((int)uVar5 < mapWidth);
      if (iVar6 != 0) {
        pqVar7 = (quint32 *)(local_68 + (long)iVar8 * 2);
        uVar5 = (ulong)iVar6;
        if (((ulong)pqVar7 & 3) != 0) {
          *(ushort *)pqVar7 = local_70;
          pqVar7 = (quint32 *)((long)pqVar7 + 2);
          uVar5 = uVar5 - 1;
        }
        if ((uVar5 & 1) != 0) {
          *(ushort *)((long)pqVar7 + (uVar5 - 1) * 2) = local_70;
        }
        (*qt_memfill32)(pqVar7,CONCAT22(local_70,local_70),
                        (long)((int)(((uint)(uVar5 >> 0x1f) & 1) + (int)uVar5) >> 1));
      }
LAB_00654d8d:
      local_68 = local_68 + (long)iVar4 * 2;
      map = map + mapStride;
      bVar1 = 1 < mapHeight;
      mapHeight = mapHeight + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

inline static void qt_bitmapblit_quint16(QRasterBuffer *rasterBuffer,
                                   int x, int y, const QRgba64 &color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride)
{
    qt_bitmapblit_template<quint16>(rasterBuffer, x,  y, color.toRgb16(),
                                    map, mapWidth, mapHeight, mapStride);
}